

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_signature_parse_der
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  int iVar1;
  undefined1 local_70 [8];
  secp256k1_scalar s;
  secp256k1_scalar r;
  size_t inputlen_local;
  uchar *input_local;
  secp256k1_ecdsa_signature *sig_local;
  secp256k1_context *ctx_local;
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (input == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"input != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_sig_parse
                      ((secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_70,input,inputlen);
    if (iVar1 == 0) {
      memset(sig,0,0x40);
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_ecdsa_signature_save(sig,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)local_70)
      ;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_signature_parse_der(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input != NULL);

    if (secp256k1_ecdsa_sig_parse(&r, &s, input, inputlen)) {
        secp256k1_ecdsa_signature_save(sig, &r, &s);
        return 1;
    } else {
        memset(sig, 0, sizeof(*sig));
        return 0;
    }
}